

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint8 * google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                  (string *str,uint8 *target)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint8 *__dest;
  uint8 *puVar5;
  size_t __n;
  
  uVar1 = str->_M_string_length;
  if ((uint)uVar1 < 0x80) {
    *target = (byte)uVar1;
    __dest = target + 1;
  }
  else {
    *target = (byte)uVar1 | 0x80;
    uVar4 = uVar1 >> 7 & 0x1ffffff;
    if ((uint)uVar1 < 0x4000) {
      target[1] = (uint8)uVar4;
      __dest = target + 2;
    }
    else {
      __dest = target + 2;
      do {
        puVar5 = __dest;
        uVar2 = (uint)uVar4;
        puVar5[-1] = (byte)uVar4 | 0x80;
        uVar3 = uVar2 >> 7;
        uVar4 = (ulong)uVar3;
        __dest = puVar5 + 1;
      } while (0x3fff < uVar2);
      *puVar5 = (uint8)uVar3;
    }
  }
  __n = (size_t)(int)str->_M_string_length;
  memcpy(__dest,(str->_M_dataplus)._M_p,__n);
  return __dest + __n;
}

Assistant:

uint8* CodedOutputStream::WriteStringWithSizeToArray(const std::string& str,
                                                     uint8* target) {
  GOOGLE_DCHECK_LE(str.size(), kuint32max);
  target = WriteVarint32ToArray(str.size(), target);
  return WriteStringToArray(str, target);
}